

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>::
int_writer<__int128>
          (int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>
           *this,back_insert_iterator<fmt::v6::detail::buffer<char>_> output,locale_ref loc,
          __int128 value,basic_format_specs<char> *s)

{
  unsigned___int128 *puVar1;
  long lVar2;
  undefined1 value_00 [16];
  unsigned___int128 uVar3;
  bool bVar4;
  undefined8 in_R8;
  basic_format_specs<char> *in_R9;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  char cVar5;
  basic_format_specs<char> *s_local;
  __int128 value_local;
  int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>
  *this_local;
  locale_ref loc_local;
  back_insert_iterator<fmt::v6::detail::buffer<char>_> output_local;
  
  (this->out).container = output.container;
  (this->locale).locale_ = loc.locale_;
  this->specs = in_R9;
  *(undefined8 *)((long)&this->abs_value + 8) = in_R8;
  *(basic_format_specs<char> **)&this->abs_value = s;
  this->prefix_size = 0;
  value_00[6] = in_stack_ffffffffffffff8e;
  value_00._0_6_ = in_stack_ffffffffffffff88;
  value_00[7] = in_stack_ffffffffffffff8f;
  value_00._8_8_ = this;
  bVar4 = is_negative<__int128,_0>((detail *)s,(__int128)value_00);
  if (bVar4) {
    this->prefix[0] = '-';
    this->prefix_size = this->prefix_size + 1;
    lVar2 = *(long *)((long)&this->abs_value + 8);
    puVar1 = &this->abs_value;
    uVar3 = *puVar1;
    *(long *)puVar1 = -(long)*puVar1;
    *(ulong *)((long)&this->abs_value + 8) = -(ulong)((long)uVar3 != 0) - lVar2;
  }
  else if ((((byte)this->specs->field_0x9 >> 4 & 7) != 0) &&
          (((byte)this->specs->field_0x9 >> 4 & 7) != 1)) {
    cVar5 = '+';
    if (((byte)this->specs->field_0x9 >> 4 & 7) != 2) {
      cVar5 = ' ';
    }
    this->prefix[0] = cVar5;
    this->prefix_size = this->prefix_size + 1;
  }
  return;
}

Assistant:

int_writer(OutputIt output, locale_ref loc, Int value,
             const basic_format_specs<Char>& s)
      : out(output),
        locale(loc),
        specs(s),
        abs_value(static_cast<UInt>(value)),
        prefix_size(0) {
    static_assert(std::is_same<uint32_or_64_or_128_t<Int>, UInt>::value, "");
    if (is_negative(value)) {
      prefix[0] = '-';
      ++prefix_size;
      abs_value = 0 - abs_value;
    } else if (specs.sign != sign::none && specs.sign != sign::minus) {
      prefix[0] = specs.sign == sign::plus ? '+' : ' ';
      ++prefix_size;
    }
  }